

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int aec_encode_get_offsets(aec_stream *strm,size_t *offsets,size_t offsets_count)

{
  internal_state *piVar1;
  size_t sVar2;
  size_t *__src;
  internal_state *state;
  size_t offsets_count_local;
  size_t *offsets_local;
  aec_stream *strm_local;
  
  piVar1 = strm->state;
  if (piVar1->offsets == (vector_t *)0x0) {
    strm_local._4_4_ = -5;
  }
  else {
    sVar2 = vector_size(piVar1->offsets);
    if (offsets_count < sVar2) {
      strm_local._4_4_ = -4;
    }
    else {
      __src = vector_data(piVar1->offsets);
      memcpy(offsets,__src,offsets_count << 3);
      strm_local._4_4_ = 0;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int aec_encode_get_offsets(struct aec_stream *strm, size_t *offsets, size_t offsets_count)
{
    struct internal_state *state = strm->state;
    if (state->offsets == NULL) {
        return AEC_RSI_OFFSETS_ERROR;
    }
    if (offsets_count < vector_size(state->offsets)) {
        return AEC_MEM_ERROR;
    }
    memcpy(offsets, vector_data(state->offsets), offsets_count * sizeof(size_t));
    return AEC_OK;
}